

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> __thiscall
baryonyx::itm::generate_seed(itm *this,random_engine *rng,uint thread_id)

{
  long lVar1;
  result_type_conflict rVar2;
  uint uVar3;
  ulong uVar4;
  uint i;
  uint uVar5;
  uint uVar6;
  uniform_int_distribution<unsigned_long> dst;
  
  std::make_unique<unsigned_long[]>((size_t)this);
  dst._M_param._M_a = 0;
  dst._M_param._M_b = 0xffffffffffffffff;
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()(&dst,rng);
  **(result_type_conflict **)this = rVar2;
  uVar5 = 1;
  uVar6 = 0;
LAB_0013555e:
  if (uVar5 == thread_id) {
    return (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)this;
  }
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()(&dst,rng);
  uVar4 = (ulong)uVar5;
  do {
    lVar1 = *(long *)this;
    *(result_type_conflict *)(lVar1 + uVar4 * 8) = rVar2;
    uVar3 = uVar6;
    do {
      if (uVar3 == 0) {
        uVar5 = uVar5 + 1;
        uVar6 = uVar6 + 1;
        goto LAB_0013555e;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 - 1;
    } while (*(long *)(lVar1 + uVar4 * 8) != *(long *)(lVar1 + (ulong)uVar5 * 8));
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()(&dst,rng);
  } while( true );
}

Assistant:

inline std::unique_ptr<random_engine::result_type[]>
generate_seed(random_engine& rng, unsigned thread_id)
{
    using type = random_engine::result_type;

    auto ret = std::make_unique<type[]>(thread_id);

    std::uniform_int_distribution<type> dst(std::numeric_limits<type>::min(),
                                            std::numeric_limits<type>::max());

    ret[0] = numeric_cast<type>(dst(rng));

    for (unsigned i = 1; i != thread_id; ++i) {
        ret[i] = numeric_cast<type>(dst(rng));

        unsigned j = i - 1;
        while (j > 0) {
            if (ret[j] == ret[i]) {
                ret[j] = numeric_cast<type>(dst(rng));
                j = i;
            }

            --j;
        }
    }

    return ret;
}